

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_dep_parser.cc
# Opt level: O0

void DepParserTask::convert_to_onelearner_actions
               (search *sch,v_array<unsigned_int> *actions,v_array<unsigned_int> *actions_onelearner
               ,uint32_t left_label,uint32_t right_label)

{
  v_array<unsigned_int> valid_actions;
  v_array<unsigned_int> valid_actions_00;
  v_array<unsigned_int> valid_actions_01;
  v_array<unsigned_int> valid_actions_02;
  v_array<unsigned_int> valid_actions_03;
  v_array<unsigned_int> valid_actions_04;
  bool bVar1;
  task_data *ptVar2;
  int in_ECX;
  undefined8 *in_RSI;
  search *in_RDI;
  uint32_t i_1;
  uint32_t i;
  uint32_t *num_label;
  uint32_t *sys;
  task_data *data;
  uint *puVar3;
  v_array<unsigned_int> *in_stack_fffffffffffffec0;
  v_array<unsigned_int> *pvVar4;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  uint uVar5;
  undefined8 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  size_t in_stack_fffffffffffffef8;
  uint local_f4;
  
  ptVar2 = Search::search::get_task_data<task_data>(in_RDI);
  v_array<unsigned_int>::clear(in_stack_fffffffffffffec0);
  puVar3 = (uint *)*in_RSI;
  pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
  valid_actions._begin._4_4_ = in_stack_fffffffffffffee4;
  valid_actions._begin._0_4_ = in_stack_fffffffffffffee0;
  valid_actions._end = (uint *)in_stack_fffffffffffffee8;
  valid_actions.end_array = (uint *)in_stack_fffffffffffffef0;
  valid_actions.erase_count = in_stack_fffffffffffffef8;
  bVar1 = is_valid(in_RSI[2],valid_actions);
  if (bVar1) {
    v_array<unsigned_int>::push_back(pvVar4,puVar3);
  }
  if (ptVar2->transition_system == 2) {
    puVar3 = (uint *)*in_RSI;
    pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
    valid_actions_00._begin._4_4_ = in_stack_fffffffffffffee4;
    valid_actions_00._begin._0_4_ = in_stack_fffffffffffffee0;
    valid_actions_00._end = (uint *)in_stack_fffffffffffffee8;
    valid_actions_00.end_array = (uint *)in_stack_fffffffffffffef0;
    valid_actions_00.erase_count = in_stack_fffffffffffffef8;
    bVar1 = is_valid(in_RSI[2],valid_actions_00);
    if (bVar1) {
      v_array<unsigned_int>::push_back(pvVar4,puVar3);
    }
  }
  if (in_ECX != 9999999) {
    puVar3 = (uint *)*in_RSI;
    pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
    valid_actions_01._begin._4_4_ = in_stack_fffffffffffffee4;
    valid_actions_01._begin._0_4_ = in_stack_fffffffffffffee0;
    valid_actions_01._end = (uint *)in_stack_fffffffffffffee8;
    valid_actions_01.end_array = (uint *)in_stack_fffffffffffffef0;
    valid_actions_01.erase_count = in_stack_fffffffffffffef8;
    bVar1 = is_valid(in_RSI[2],valid_actions_01);
    if (bVar1) {
      v_array<unsigned_int>::push_back(pvVar4,puVar3);
    }
  }
  if (in_ECX != 9999999) {
    puVar3 = (uint *)*in_RSI;
    pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
    valid_actions_02._begin._4_4_ = in_stack_fffffffffffffee4;
    valid_actions_02._begin._0_4_ = in_stack_fffffffffffffee0;
    valid_actions_02._end = (uint *)in_stack_fffffffffffffee8;
    valid_actions_02.end_array = (uint *)in_stack_fffffffffffffef0;
    valid_actions_02.erase_count = in_stack_fffffffffffffef8;
    bVar1 = is_valid(in_RSI[2],valid_actions_02);
    if (bVar1) {
      v_array<unsigned_int>::push_back(pvVar4,puVar3);
    }
  }
  if (in_ECX == 9999999) {
    puVar3 = (uint *)*in_RSI;
    pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
    valid_actions_03._begin._4_4_ = in_stack_fffffffffffffee4;
    valid_actions_03._begin._0_4_ = in_stack_fffffffffffffee0;
    valid_actions_03._end = (uint *)in_stack_fffffffffffffee8;
    valid_actions_03.end_array = (uint *)in_stack_fffffffffffffef0;
    valid_actions_03.erase_count = in_stack_fffffffffffffef8;
    bVar1 = is_valid(in_RSI[2],valid_actions_03);
    if (bVar1) {
      for (local_f4 = 0; local_f4 < ptVar2->num_label; local_f4 = local_f4 + 1) {
        if ((ulong)local_f4 != ptVar2->root_label - 1) {
          v_array<unsigned_int>::push_back(pvVar4,puVar3);
        }
      }
    }
  }
  if (in_ECX == 9999999) {
    puVar3 = (uint *)*in_RSI;
    pvVar4 = (v_array<unsigned_int> *)in_RSI[1];
    valid_actions_04._begin._4_4_ = in_stack_fffffffffffffee4;
    valid_actions_04._begin._0_4_ = in_stack_fffffffffffffee0;
    valid_actions_04._end = puVar3;
    valid_actions_04.end_array = (uint *)pvVar4;
    valid_actions_04.erase_count = in_RSI[2];
    bVar1 = is_valid(in_RSI[2],valid_actions_04);
    if (bVar1) {
      for (uVar5 = 0; uVar5 < ptVar2->num_label; uVar5 = uVar5 + 1) {
        if ((ptVar2->transition_system == 2) || ((ulong)uVar5 != ptVar2->root_label - 1)) {
          v_array<unsigned_int>::push_back(pvVar4,puVar3);
        }
      }
    }
  }
  return;
}

Assistant:

void convert_to_onelearner_actions(Search::search &sch, v_array<action> &actions, v_array<action> &actions_onelearner,
    uint32_t left_label, uint32_t right_label)
{
  task_data *data = sch.get_task_data<task_data>();
  uint32_t &sys = data->transition_system;
  uint32_t &num_label = data->num_label;
  actions_onelearner.clear();
  if (is_valid(SHIFT, actions))
    actions_onelearner.push_back(SHIFT);
  if (sys == arc_eager && is_valid(REDUCE, actions))
    actions_onelearner.push_back(2 + 2 * num_label);
  if (left_label != my_null && is_valid(REDUCE_RIGHT, actions))
    actions_onelearner.push_back(1 + right_label);
  if (left_label != my_null && is_valid(REDUCE_LEFT, actions))
    actions_onelearner.push_back(1 + left_label + num_label);
  if (left_label == my_null && is_valid(REDUCE_RIGHT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (i != data->root_label - 1)
        actions_onelearner.push_back(i + 2);
  if (left_label == my_null && is_valid(REDUCE_LEFT, actions))
    for (uint32_t i = 0; i < num_label; i++)
      if (sys == arc_eager || i != data->root_label - 1)
        actions_onelearner.push_back((uint32_t)(i + 2 + num_label));
}